

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutablePrimitiveOneofFieldLiteGenerator::GenerateMembers
          (ImmutablePrimitiveOneofFieldLiteGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  Printer *pPVar2;
  bool bVar3;
  LogMessage *pLVar4;
  Options *pOVar5;
  string_view local_228;
  Options local_218;
  string_view local_1c8;
  Options local_1b8;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_160;
  string_view local_158;
  string_view local_148;
  string_view local_138;
  Options local_128;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_d0;
  string_view local_c8;
  string_view local_b8;
  string_view local_a8;
  Options local_98;
  byte local_31;
  LogMessage local_30;
  Voidify local_19;
  Printer *local_18;
  Printer *printer_local;
  ImmutablePrimitiveOneofFieldLiteGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  PrintExtraFieldInfo(&(this->super_ImmutablePrimitiveFieldLiteGenerator).variables_,printer);
  bVar3 = FieldDescriptor::has_presence
                    ((this->super_ImmutablePrimitiveFieldLiteGenerator).descriptor_);
  local_31 = 0;
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/lite/primitive_field.cc"
               ,0x16d,"descriptor_->has_presence()");
    local_31 = 1;
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar4);
  }
  pPVar2 = local_18;
  if ((local_31 & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_30);
  }
  pFVar1 = (this->super_ImmutablePrimitiveFieldLiteGenerator).descriptor_;
  pOVar5 = Context::options((this->super_ImmutablePrimitiveFieldLiteGenerator).context_);
  java::Options::Options(&local_98,pOVar5);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,HAZZER,&local_98,false,false,false);
  java::Options::~Options(&local_98);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_a8,
             "@java.lang.Override\n$deprecation$public boolean ${$has$capitalized_name$$}$() {\n  return $has_oneof_case_message$;\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutablePrimitiveFieldLiteGenerator).variables_,local_a8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c8,"}");
  pFVar1 = (this->super_ImmutablePrimitiveFieldLiteGenerator).descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_d0);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>(pPVar2,local_b8,local_c8,pFVar1,local_d0)
  ;
  pPVar2 = local_18;
  pFVar1 = (this->super_ImmutablePrimitiveFieldLiteGenerator).descriptor_;
  pOVar5 = Context::options((this->super_ImmutablePrimitiveFieldLiteGenerator).context_);
  java::Options::Options(&local_128,pOVar5);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,GETTER,&local_128,false,false,false);
  java::Options::~Options(&local_128);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_138,
             "@java.lang.Override\n$deprecation$public $type$ ${$get$capitalized_name$$}$() {\n  if ($has_oneof_case_message$) {\n    return ($boxed_type$) $oneof_name$_;\n  }\n  return $default$;\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutablePrimitiveFieldLiteGenerator).variables_,local_138);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_148,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_158,"}");
  pFVar1 = (this->super_ImmutablePrimitiveFieldLiteGenerator).descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_160);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_148,local_158,pFVar1,local_160);
  pPVar2 = local_18;
  pFVar1 = (this->super_ImmutablePrimitiveFieldLiteGenerator).descriptor_;
  pOVar5 = Context::options((this->super_ImmutablePrimitiveFieldLiteGenerator).context_);
  java::Options::Options(&local_1b8,pOVar5);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,SETTER,&local_1b8,false,false,true);
  java::Options::~Options(&local_1b8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1c8,
             "private void set$capitalized_name$($type$ value) {\n$null_check$  $set_oneof_case_message$;\n  $oneof_name$_ = value;\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutablePrimitiveFieldLiteGenerator).variables_,local_1c8);
  pPVar2 = local_18;
  pFVar1 = (this->super_ImmutablePrimitiveFieldLiteGenerator).descriptor_;
  pOVar5 = Context::options((this->super_ImmutablePrimitiveFieldLiteGenerator).context_);
  java::Options::Options(&local_218,pOVar5);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,CLEARER,&local_218,false,false,true);
  java::Options::~Options(&local_218);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_228,
             "private void clear$capitalized_name$() {\n  if ($has_oneof_case_message$) {\n    $clear_oneof_case_message$;\n    $oneof_name$_ = null;\n  }\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutablePrimitiveFieldLiteGenerator).variables_,local_228);
  return;
}

Assistant:

void ImmutablePrimitiveOneofFieldLiteGenerator::GenerateMembers(
    io::Printer* printer) const {
  PrintExtraFieldInfo(variables_, printer);
  ABSL_DCHECK(descriptor_->has_presence());
  WriteFieldAccessorDocComment(printer, descriptor_, HAZZER,
                               context_->options());
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public boolean ${$has$capitalized_name$$}$() {\n"
                 "  return $has_oneof_case_message$;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  WriteFieldAccessorDocComment(printer, descriptor_, GETTER,
                               context_->options());
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public $type$ ${$get$capitalized_name$$}$() {\n"
                 "  if ($has_oneof_case_message$) {\n"
                 "    return ($boxed_type$) $oneof_name$_;\n"
                 "  }\n"
                 "  return $default$;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  WriteFieldAccessorDocComment(printer, descriptor_, SETTER,
                               context_->options(), /* builder */ false,
                               /* kdoc */ false, /* is_private */ true);
  printer->Print(variables_,
                 "private void set$capitalized_name$($type$ value) {\n"
                 "$null_check$"
                 "  $set_oneof_case_message$;\n"
                 "  $oneof_name$_ = value;\n"
                 "}\n");

  WriteFieldAccessorDocComment(printer, descriptor_, CLEARER,
                               context_->options(), /* builder */ false,
                               /* kdoc */ false, /* is_private */ true);
  printer->Print(variables_,
                 "private void clear$capitalized_name$() {\n"
                 "  if ($has_oneof_case_message$) {\n"
                 "    $clear_oneof_case_message$;\n"
                 "    $oneof_name$_ = null;\n"
                 "  }\n"
                 "}\n");
}